

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureLoad
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd,Uint32 ArrayDim)

{
  bool bVar1;
  pointer pHVar2;
  Char *Message;
  char *pcVar3;
  char (*Args_1) [60];
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  HLSLTokenInfo local_3e8;
  const_iterator local_398;
  _List_node_base *local_390;
  allocator local_381;
  string local_380;
  allocator local_359;
  string local_358;
  HLSLTokenInfo local_338;
  const_iterator local_2e8;
  _List_node_base *local_2e0;
  allocator local_2d1;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  HLSLTokenInfo local_288;
  const_iterator local_238;
  _List_node_base *local_230;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  HLSLTokenInfo local_1d8;
  const_iterator local_188;
  _List_node_base *local_180;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  HLSLTokenInfo local_128;
  const_iterator local_d8;
  undefined1 local_d0 [8];
  string msg;
  String local_a0;
  undefined1 local_80 [8];
  string err;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_58;
  _List_node_base *local_50;
  uint local_44;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Stack_40;
  Uint32 ArrayIdx;
  iterator ClosingStapleToken;
  iterator OpenStapleToken;
  Uint32 ArrayDim_local;
  iterator *ScopeEnd_local;
  iterator *Token_local;
  ConversionStream *this_local;
  
  ClosingStapleToken = (iterator)Token->_M_node;
  _Stack_40._M_node = ScopeEnd->_M_node;
  local_44 = 0;
  while( true ) {
    Args_1 = (char (*) [60])(ulong)(ArrayDim + 1);
    if (ArrayDim + 1 <= local_44) {
      std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                (&local_d8,Token);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"imageLoad",&local_149);
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,pcVar3,&local_171);
      Parsing::HLSLTokenInfo::HLSLTokenInfo
                (&local_128,Identifier,&local_148,&local_170,0xffffffffffffffff);
      local_180 = (_List_node_base *)
                  std::__cxx11::
                  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  ::insert(&this->m_Tokens,local_d8,&local_128);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_128);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                (&local_188,Token);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,"(",&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_220,"",&local_221);
      Parsing::HLSLTokenInfo::HLSLTokenInfo
                (&local_1d8,OpenParen,&local_1f8,&local_220,0xffffffffffffffff);
      local_230 = (_List_node_base *)
                  std::__cxx11::
                  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  ::insert(&this->m_Tokens,local_188,&local_1d8);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_1d8);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      std::__cxx11::string::operator=((string *)&pHVar2->Delimiter," ");
      std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                (&local_238,&ClosingStapleToken);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2a8,",",&local_2a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d0,"",&local_2d1);
      Parsing::HLSLTokenInfo::HLSLTokenInfo
                (&local_288,Comma,&local_2a8,&local_2d0,0xffffffffffffffff);
      local_2e0 = (_List_node_base *)
                  std::__cxx11::
                  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  ::insert(&this->m_Tokens,local_238,&local_288);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_288);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                (&local_2e8,&ClosingStapleToken);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_358,"_ToIvec",&local_359);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_380," ",&local_381);
      Parsing::HLSLTokenInfo::HLSLTokenInfo
                (&local_338,Identifier,&local_358,&local_380,0xffffffffffffffff);
      local_390 = (_List_node_base *)
                  std::__cxx11::
                  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  ::insert(&this->m_Tokens,local_2e8,&local_338);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_338);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         (&ClosingStapleToken);
      pHVar2->Type = OpenParen;
      pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         (&ClosingStapleToken);
      std::__cxx11::string::operator=((string *)&pHVar2->Literal,"(");
      std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                (&local_398,&stack0xffffffffffffffc0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_408,")",&local_409);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_430,"",&local_431);
      Parsing::HLSLTokenInfo::HLSLTokenInfo
                (&local_3e8,ClosingParen,&local_408,&local_430,0xffffffffffffffff);
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      insert(&this->m_Tokens,local_398,&local_3e8);
      Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_3e8);
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator((allocator<char> *)&local_431);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         (&stack0xffffffffffffffc0);
      pHVar2->Type = ClosingParen;
      pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         (&stack0xffffffffffffffc0);
      std::__cxx11::string::operator=((string *)&pHVar2->Literal,")");
      Token->_M_node = (_List_node_base *)ClosingStapleToken;
      return true;
    }
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&ClosingStapleToken);
    bVar1 = std::operator==(&ClosingStapleToken,ScopeEnd);
    if ((bVar1) ||
       (pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                           (&ClosingStapleToken), pHVar2->Type != OpenSquareBracket)) break;
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         begin(&this->m_Tokens);
    err.field_2._8_8_ = ClosingStapleToken._M_node;
    local_50 = (_List_node_base *)
               Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                         (&local_58,ScopeEnd,ClosingStapleToken._M_node);
    _Stack_40 = (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)local_50;
    bVar1 = std::operator!=(Token,ScopeEnd);
    if (!bVar1) {
      FormatString<char[47]>
                ((string *)local_80,(char (*) [47])"Unable to find matching closing square bracket")
      ;
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_a0,this,Token,4);
      Args_1 = (char (*) [60])0x83f;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessRWTextureLoad",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x83f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80,(char (*) [2])0xe6c869,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)local_80);
    }
    pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       (&stack0xffffffffffffffc0);
    if (pHVar2->Type != ClosingSquareBracket) {
      FormatString<char[26],char[60]>
                ((string *)local_d0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"ClosingStapleToken->Type == TokenType::ClosingSquareBracket",Args_1
                );
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"ProcessRWTextureLoad",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x844);
      std::__cxx11::string::~string((string *)local_d0);
    }
    if (local_44 < ArrayDim) {
      ClosingStapleToken._M_node = _Stack_40._M_node;
    }
    local_44 = local_44 + 1;
  }
  return false;
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureLoad(TokenListType::iterator&       Token,
                                                                    const TokenListType::iterator& ScopeEnd,
                                                                    Uint32                         ArrayDim)
{
    // RWTex[Location.xy]
    // ^

    // Find the last pair of square brackets, skipping texture array indexing
    auto OpenStapleToken    = Token;
    auto ClosingStapleToken = ScopeEnd;
    for (Uint32 ArrayIdx = 0; ArrayIdx < ArrayDim + 1; ++ArrayIdx)
    {
        ++OpenStapleToken;
        if (OpenStapleToken == ScopeEnd || OpenStapleToken->Type != TokenType::OpenSquareBracket)
            return false;

        ClosingStapleToken = Parsing::FindMatchingBracket(m_Tokens.begin(), ScopeEnd, OpenStapleToken);
        VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching closing square bracket");

        // RWTex[Location[idx].xy]
        //                       ^
        //              ClosingStapleToken
        VERIFY_EXPR(ClosingStapleToken->Type == TokenType::ClosingSquareBracket);

        if (ArrayIdx < ArrayDim)
        {
            OpenStapleToken = ClosingStapleToken;
            // RWTexArray[idx[0]][Location.xy]
            //                  ^
            //            OpenStapleToken
        }
    }
    //      RWTex[Location.xy]
    //           ^           ^
    //  OpenStaplePos     ClosingStaplePos

    m_Tokens.insert(Token, TokenInfo(TokenType::Identifier, "imageLoad", Token->Delimiter.c_str()));
    m_Tokens.insert(Token, TokenInfo(TokenType::OpenParen, "(", ""));
    Token->Delimiter = " ";
    // imageLoad( RWTex[Location.xy]
    //            ^    ^
    //        Token   OpenStaplePos

    m_Tokens.insert(OpenStapleToken, TokenInfo(TokenType::Comma, ",", ""));
    m_Tokens.insert(OpenStapleToken, TokenInfo(TokenType::Identifier, "_ToIvec", " "));
    // imageLoad( RWTex, _ToIvec[Location.xy]
    //                          ^
    //                       OpenStapleToken

    OpenStapleToken->Type    = TokenType::OpenParen;
    OpenStapleToken->Literal = "(";
    // imageLoad( RWTex, _ToIvec(Location.xy]
    //                          ^           ^
    //                 OpenStapleToken    ClosingStapleToken

    m_Tokens.insert(ClosingStapleToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageLoad( RWTex, _ToIvec(Location.xy)]
    //                                       ^
    //                                   ClosingStapleToken


    ClosingStapleToken->Type    = TokenType::ClosingParen;
    ClosingStapleToken->Literal = ")";
    // imageLoad( RWTex, _ToIvec(Location.xy))
    //                          ^
    //                      OpenStapleToken

    Token = OpenStapleToken;

    // Note that 'Location' may require further conversion

    return true;
}